

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1212592::cmCMakeLanguageCommandDEFER
          (anon_unknown_dwarf_1212592 *this,Defer *defer,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,size_t arg,cmExecutionStatus *status)

{
  long *plVar1;
  size_type sVar2;
  bool bVar3;
  string *psVar4;
  char cVar5;
  _Alloc_hider _Var6;
  long lVar7;
  string *id;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view value;
  string_view value_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> call;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ids;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  long *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  bool local_68;
  string local_60;
  static_string_view local_40;
  
  if (this == (anon_unknown_dwarf_1212592 *)0x0) {
    this = (anon_unknown_dwarf_1212592 *)status->Makefile;
  }
  plVar1 = (long *)(&defer->Id)[arg]._M_dataplus._M_p;
  sVar2 = (&defer->Id)[arg]._M_string_length;
  if (sVar2 == 8) {
    if (*plVar1 == 0x4c4c41435f544547) {
      lVar7 = (long)args - (long)defer >> 5;
      if (arg + 1 == lVar7) {
        local_d0._0_8_ = &local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,"DEFER GET_CALL missing id","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else if (arg + 2 == lVar7) {
        local_d0._0_8_ = &local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,"DEFER GET_CALL missing output variable","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else if (arg + 3 == lVar7) {
        psVar4 = &defer->IdVar + arg;
        if (psVar4->_M_string_length != 0) {
          if (0x19 < (byte)(*(psVar4->_M_dataplus)._M_p + 0xbfU)) {
            cmMakefile::DeferGetCall
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_d0,(cmMakefile *)this,psVar4);
            cVar5 = local_b0._0_1_;
            if (local_b0._0_1_ == false) {
              local_60._M_dataplus._M_p = &DAT_0000002b;
              local_60._M_string_length = 0x8ac567;
              psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this);
              local_40.super_string_view._M_len = 0xe;
              local_40.super_string_view._M_str = "\nat this time.";
              cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view>
                        ((string *)local_88,(static_string_view *)&local_60,psVar4,&local_40);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              cmSystemTools::s_FatalErrorOccurred = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._0_8_ != &local_78) {
                operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
              }
            }
            else {
              value_00._M_str = (char *)local_d0._0_8_;
              value_00._M_len = local_d0._8_8_;
              cmMakefile::AddDefinition
                        (status->Makefile,(string *)(&defer->Directory + arg * 4),value_00);
            }
            if (local_b0._0_1_ != true) {
              return (bool)cVar5;
            }
            local_b0 = (long *)((ulong)local_b0 & 0xffffffffffffff00);
            local_78._M_allocated_capacity = local_c0._M_allocated_capacity;
            local_88._0_8_ = local_d0._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._0_8_ == &local_c0) {
              return (bool)cVar5;
            }
            goto LAB_003a4112;
          }
          local_88._0_8_ = (pointer)0x22;
          local_88._8_8_ = "DEFER GET_CALL unknown argument:\n ";
          cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
                    ((string *)local_d0,(static_string_view *)local_88,psVar4);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          local_78._M_allocated_capacity = local_c0._M_allocated_capacity;
          _Var6._M_p = (pointer)local_d0._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._0_8_ == &local_c0) {
            cmSystemTools::s_FatalErrorOccurred = true;
            return false;
          }
          goto LAB_003a3de4;
        }
        local_d0._0_8_ = &local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,"DEFER GET_CALL id may not be empty","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        local_d0._0_8_ = &local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,"DEFER GET_CALL given too many arguments","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
LAB_003a4185:
      local_78._M_allocated_capacity = local_c0._M_allocated_capacity;
      _Var6._M_p = (pointer)local_d0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ == &local_c0) {
        cmSystemTools::s_FatalErrorOccurred = true;
        return false;
      }
      goto LAB_003a3de4;
    }
LAB_003a3d7d:
    local_d0._0_8_ = &DAT_00000019;
    local_d0._8_8_ = "DEFER operation unknown: ";
    local_c0._M_allocated_capacity = 0;
    local_a8 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_d0;
    local_c0._8_8_ = sVar2;
    local_b0 = plVar1;
    cmCatViews((string *)local_88,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (sVar2 == 0xc) {
      if ((int)plVar1[1] == 0x5344495f && *plVar1 == 0x4c4c41435f544547) {
        lVar7 = (long)args - (long)defer >> 5;
        if (arg + 1 == lVar7) {
          local_d0._0_8_ = &local_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,"DEFER GET_CALL_IDS missing output variable","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (arg + 2 == lVar7) {
            cmMakefile::DeferGetCallIds_abi_cxx11_
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_88,(cmMakefile *)this);
            cVar5 = local_68;
            if (local_68 == false) {
              psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this);
              local_d0._0_8_ = (pointer)0x2f;
              local_d0._8_8_ = "DEFER GET_CALL_IDS may not access directory:\n  ";
              local_c0._M_allocated_capacity = 0;
              local_b0 = (long *)(psVar4->_M_dataplus)._M_p;
              local_c0._8_8_ = psVar4->_M_string_length;
              local_a8 = 0;
              local_a0 = 0xe;
              local_98 = "\nat this time.";
              local_90 = 0;
              views_02._M_len = 3;
              views_02._M_array = (iterator)local_d0;
              cmCatViews(&local_60,views_02);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              cmSystemTools::s_FatalErrorOccurred = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              value._M_str = (char *)local_88._0_8_;
              value._M_len = local_88._8_8_;
              cmMakefile::AddDefinition(status->Makefile,&defer->IdVar + arg,value);
            }
            if (local_68 != true) {
              return (bool)cVar5;
            }
            local_68 = false;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._0_8_ == &local_78) {
              return (bool)cVar5;
            }
LAB_003a4112:
            operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
            return (bool)cVar5;
          }
          local_d0._0_8_ = &local_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d0,"DEFER GET_CALL_IDS given too many arguments","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        goto LAB_003a4185;
      }
      goto LAB_003a3d7d;
    }
    if ((sVar2 != 0xb) ||
       (*(long *)((long)plVar1 + 3) != 0x4c4c41435f4c4543 || *plVar1 != 0x435f4c45434e4143))
    goto LAB_003a3d7d;
    psVar4 = &defer->Id + arg;
    do {
      id = psVar4 + 1;
      if (id == (string *)args) {
        return true;
      }
      local_b0 = (long *)(id->_M_dataplus)._M_p;
      if ((byte)((char)*local_b0 + 0xbfU) < 0x1a) {
        local_d0._0_8_ = (pointer)0x26;
        local_d0._8_8_ = "DEFER CANCEL_CALL unknown argument:\n  ";
        local_c0._M_allocated_capacity = 0;
        local_c0._8_8_ = psVar4[1]._M_string_length;
        local_a8 = 0;
        views_00._M_len = 2;
        views_00._M_array = (iterator)local_d0;
        cmCatViews((string *)local_88,views_00);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_003a3dc7;
      }
      bVar3 = cmMakefile::DeferCancelCall((cmMakefile *)this,id);
      psVar4 = id;
    } while (bVar3);
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)this);
    local_d0._0_8_ = (pointer)0x2e;
    local_d0._8_8_ = "DEFER CANCEL_CALL may not update directory:\n  ";
    local_c0._M_allocated_capacity = 0;
    local_b0 = (long *)(psVar4->_M_dataplus)._M_p;
    local_c0._8_8_ = psVar4->_M_string_length;
    local_a8 = 0;
    local_a0 = 0xe;
    local_98 = "\nat this time.";
    local_90 = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_d0;
    cmCatViews((string *)local_88,views_01);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_003a3dc7:
  _Var6._M_p = (pointer)local_88._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ == &local_78) {
    cmSystemTools::s_FatalErrorOccurred = true;
    return false;
  }
LAB_003a3de4:
  cmSystemTools::s_FatalErrorOccurred = true;
  operator_delete(_Var6._M_p,local_78._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmCMakeLanguageCommandDEFER(Defer const& defer,
                                 std::vector<std::string> const& args,
                                 size_t arg, cmExecutionStatus& status)
{
  cmMakefile* deferMakefile =
    defer.Directory ? defer.Directory : &status.GetMakefile();
  if (args[arg] == "CANCEL_CALL"_s) {
    ++arg; // Consume CANCEL_CALL.
    auto ids = cmMakeRange(args).advance(arg);
    for (std::string const& id : ids) {
      if (id[0] >= 'A' && id[0] <= 'Z') {
        return FatalError(
          status, cmStrCat("DEFER CANCEL_CALL unknown argument:\n  "_s, id));
      }
      if (!deferMakefile->DeferCancelCall(id)) {
        return FatalError(
          status,
          cmStrCat("DEFER CANCEL_CALL may not update directory:\n  "_s,
                   deferMakefile->GetCurrentBinaryDirectory(),
                   "\nat this time."_s));
      }
    }
    return true;
  }
  if (args[arg] == "GET_CALL_IDS"_s) {
    ++arg; // Consume GET_CALL_IDS.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL_IDS given too many arguments");
    }
    cm::optional<std::string> ids = deferMakefile->DeferGetCallIds();
    if (!ids) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL_IDS may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *ids);
    return true;
  }
  if (args[arg] == "GET_CALL"_s) {
    ++arg; // Consume GET_CALL.
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing id");
    }
    std::string const& id = args[arg++];
    if (arg == args.size()) {
      return FatalError(status, "DEFER GET_CALL missing output variable");
    }
    std::string const& var = args[arg++];
    if (arg != args.size()) {
      return FatalError(status, "DEFER GET_CALL given too many arguments");
    }
    if (id.empty()) {
      return FatalError(status, "DEFER GET_CALL id may not be empty");
    }
    if (id[0] >= 'A' && id[0] <= 'Z') {
      return FatalError(status,
                        cmStrCat("DEFER GET_CALL unknown argument:\n "_s, id));
    }
    cm::optional<std::string> call = deferMakefile->DeferGetCall(id);
    if (!call) {
      return FatalError(
        status,
        cmStrCat("DEFER GET_CALL may not access directory:\n  "_s,
                 deferMakefile->GetCurrentBinaryDirectory(),
                 "\nat this time."_s));
    }
    status.GetMakefile().AddDefinition(var, *call);
    return true;
  }
  return FatalError(status,
                    cmStrCat("DEFER operation unknown: "_s, args[arg]));
}